

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void __thiscall testing::ScopedTrace::~ScopedTrace(ScopedTrace *this)

{
  pointer pTVar1;
  pointer pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  
  UnitTest::GetInstance();
  pTVar1 = ((UnitTest::GetInstance::instance.impl_)->gtest_trace_stack_).value_.
           super__Vector_base<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  ((UnitTest::GetInstance::instance.impl_)->gtest_trace_stack_).value_.
  super__Vector_base<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_>.
  _M_impl.super__Vector_impl_data._M_finish = pTVar1 + -1;
  pcVar2 = pTVar1[-1].message._M_dataplus._M_p;
  paVar3 = &pTVar1[-1].message.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar3) {
    operator_delete(pcVar2,paVar3->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

GTEST_LOCK_EXCLUDED_(&UnitTest::mutex_) {
  UnitTest::GetInstance()->PopGTestTrace();
}